

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::Q3BSPFileImporter::importTextureFromArchive
          (Q3BSPFileImporter *this,Q3BSPModel *model,ZipArchiveIOSystem *archive,aiScene *param_3,
          aiMaterial *pMatHelper,int textureId)

{
  pointer *pppaVar1;
  pointer pcVar2;
  pointer ppsVar3;
  sQ3BSPTexture *__s;
  iterator __position;
  long lVar4;
  bool bVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  undefined4 extraout_var;
  aiTexture *paVar11;
  aiTexel *paVar12;
  ulong uVar13;
  ulong uVar14;
  char *__s_00;
  Q3BSPFileImporter *pQVar15;
  char *pcVar16;
  bool bVar17;
  aiTexture *pTexture;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  supportedExtensions;
  string ext;
  string textureName;
  aiString name;
  aiTexture *local_4a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  string local_480;
  string local_460;
  Q3BSPFileImporter *local_440;
  undefined1 local_438 [1032];
  long *plVar10;
  
  if ((textureId < 0 || (pMatHelper == (aiMaterial *)0x0 || archive == (ZipArchiveIOSystem *)0x0))
     || (ppsVar3 = (model->m_Textures).
                   super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(model->m_Textures).
                            super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar3) >> 3) <=
        textureId)) {
    bVar17 = false;
  }
  else {
    __s = ppsVar3[(uint)textureId];
    bVar17 = __s != (sQ3BSPTexture *)0x0;
    if (bVar17) {
      local_498.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_498.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_498.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar2 = local_438 + 0x10;
      local_440 = this;
      local_438._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,".jpg","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_498,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
      if ((pointer)local_438._0_8_ != pcVar2) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      local_438._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,".png","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_498,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
      if ((pointer)local_438._0_8_ != pcVar2) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      local_438._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,".tga","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_498,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
      if ((pointer)local_438._0_8_ != pcVar2) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      local_460._M_string_length = 0;
      local_460.field_2._M_local_buf[0] = '\0';
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      local_480._M_string_length = 0;
      local_480.field_2._M_local_buf[0] = '\0';
      pQVar15 = (Q3BSPFileImporter *)local_438;
      local_438._0_8_ = pcVar2;
      sVar9 = strlen(__s->strName);
      std::__cxx11::string::_M_construct<char_const*>((string *)pQVar15,__s,__s->strName + sVar9);
      bVar17 = expandFile(pQVar15,archive,(string *)local_438,&local_498,&local_460,&local_480);
      if ((pointer)local_438._0_8_ != pcVar2) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      if (bVar17) {
        iVar7 = (*(archive->super_IOSystem)._vptr_IOSystem[4])
                          (archive,local_460._M_dataplus._M_p,"rb");
        plVar10 = (long *)CONCAT44(extraout_var,iVar7);
        if (plVar10 == (long *)0x0) {
          local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
          memset(local_438 + 5,0x1b,0x3ff);
          strncpy(local_438 + 4,__s->strName,0x400);
          sVar9 = strlen(local_438 + 4);
          local_438._0_4_ = (int)sVar9;
          aiMaterial::AddProperty(pMatHelper,(aiString *)local_438,"$tex.file",1,0);
        }
        else {
          uVar8 = (**(code **)(*plVar10 + 0x30))(plVar10);
          paVar11 = (aiTexture *)operator_new(0x428);
          paVar11->mWidth = 0;
          paVar11->mHeight = 0;
          paVar11->pcData = (aiTexel *)0x0;
          (paVar11->mFilename).length = 0;
          (paVar11->mFilename).data[0] = '\0';
          memset((paVar11->mFilename).data + 1,0x1b,0x3ff);
          paVar11->achFormatHint[0] = '\0';
          paVar11->achFormatHint[1] = '\0';
          paVar11->achFormatHint[2] = '\0';
          paVar11->achFormatHint[3] = '\0';
          paVar11->mHeight = 0;
          paVar11->mWidth = uVar8;
          local_4a0 = paVar11;
          paVar12 = (aiTexel *)operator_new__((ulong)uVar8);
          uVar13 = (**(code **)(*plVar10 + 0x10))(plVar10,paVar12,1,uVar8);
          pQVar15 = local_440;
          if (uVar13 != local_4a0->mWidth) {
            __assert_fail("readSize == pTexture->mWidth",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                          ,0x256,
                          "bool Assimp::Q3BSPFileImporter::importTextureFromArchive(const Q3BSP::Q3BSPModel *, ZipArchiveIOSystem *, aiScene *, aiMaterial *, int)"
                         );
          }
          local_4a0->pcData = paVar12;
          local_4a0->achFormatHint[0] = local_480._M_dataplus._M_p[1];
          local_4a0->achFormatHint[1] = local_480._M_dataplus._M_p[2];
          local_4a0->achFormatHint[2] = local_480._M_dataplus._M_p[3];
          local_4a0->achFormatHint[3] = '\0';
          __s_00 = local_438 + 5;
          local_438._0_8_ = local_438._0_8_ & 0xffffffff00000000;
          memset(__s_00,0x1b,0x3ff);
          uVar6 = local_438._0_8_;
          local_438._0_5_ = 0x2a00000000;
          uVar13 = (ulong)((long)(pQVar15->mTextures).
                                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pQVar15->mTextures).
                                super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3;
          local_438._0_4_ = 1;
          if ((int)uVar13 < 0) {
            __s_00 = local_438 + 6;
            local_438._6_2_ = SUB82(uVar6,6);
            local_438._0_6_ = 0x2d2a00000000;
            uVar13 = (ulong)(uint)-(int)uVar13;
            local_438._0_4_ = 2;
          }
          iVar7 = 1000000000;
          bVar17 = false;
          do {
            if (0x3fe < (uint)local_438._0_4_) break;
            uVar14 = (ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff;
            lVar4 = (long)uVar14 / (long)iVar7;
            uVar14 = (long)uVar14 % (long)iVar7 & 0xffffffff;
            if (((bVar17) || (iVar7 == 1)) || ((int)lVar4 != 0)) {
              pcVar16 = __s_00 + 1;
              local_438._0_4_ = local_438._0_4_ + 1;
              *__s_00 = (char)lVar4 + '0';
              bVar17 = true;
              if (iVar7 != 1) goto LAB_005969e4;
              bVar5 = false;
              iVar7 = 1;
              uVar13 = uVar14;
              __s_00 = pcVar16;
            }
            else {
              uVar14 = uVar13 & 0xffffffff;
              pcVar16 = __s_00;
LAB_005969e4:
              iVar7 = iVar7 / 10;
              bVar5 = true;
              uVar13 = uVar14;
              __s_00 = pcVar16;
            }
          } while (bVar5);
          *__s_00 = '\0';
          (*(archive->super_IOSystem)._vptr_IOSystem[5])(archive,plVar10);
          aiMaterial::AddProperty(pMatHelper,(aiString *)local_438,"$tex.file",1,0);
          __position._M_current =
               (pQVar15->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pQVar15->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiTexture*,std::allocator<aiTexture*>>::_M_realloc_insert<aiTexture*const&>
                      ((vector<aiTexture*,std::allocator<aiTexture*>> *)&pQVar15->mTextures,
                       __position,&local_4a0);
          }
          else {
            *__position._M_current = local_4a0;
            pppaVar1 = &(pQVar15->mTextures).
                        super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppaVar1 = *pppaVar1 + 1;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != &local_480.field_2) {
        operator_delete(local_480._M_dataplus._M_p,
                        CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                                 local_480.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p,
                        CONCAT71(local_460.field_2._M_allocated_capacity._1_7_,
                                 local_460.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_498);
      bVar17 = true;
    }
  }
  return bVar17;
}

Assistant:

bool Q3BSPFileImporter::importTextureFromArchive( const Q3BSP::Q3BSPModel *model,
                                                 ZipArchiveIOSystem *archive, aiScene*,
                                                 aiMaterial *pMatHelper, int textureId ) {
    if (nullptr == archive || nullptr == pMatHelper ) {
        return false;
    }

    if ( textureId < 0 || textureId >= static_cast<int>( model->m_Textures.size() ) ) {
        return false;
    }

    bool res = true;
    sQ3BSPTexture *pTexture = model->m_Textures[ textureId ];
    if ( !pTexture ) {
        return false;
    }

    std::vector<std::string> supportedExtensions;
    supportedExtensions.push_back( ".jpg" );
    supportedExtensions.push_back( ".png" );
    supportedExtensions.push_back( ".tga" );
    std::string textureName, ext;
    if ( expandFile( archive, pTexture->strName, supportedExtensions, textureName, ext ) ) {
        IOStream *pTextureStream = archive->Open( textureName.c_str() );
        if ( pTextureStream ) {
            size_t texSize = pTextureStream->FileSize();
            aiTexture *pTexture = new aiTexture;
            pTexture->mHeight = 0;
            pTexture->mWidth = static_cast<unsigned int>(texSize);
            unsigned char *pData = new unsigned char[ pTexture->mWidth ];
            size_t readSize = pTextureStream->Read( pData, sizeof( unsigned char ), pTexture->mWidth );
            (void)readSize;
            ai_assert( readSize == pTexture->mWidth );
            pTexture->pcData = reinterpret_cast<aiTexel*>( pData );
            pTexture->achFormatHint[ 0 ] = ext[ 1 ];
            pTexture->achFormatHint[ 1 ] = ext[ 2 ];
            pTexture->achFormatHint[ 2 ] = ext[ 3 ];
            pTexture->achFormatHint[ 3 ] = '\0';
            res = true;

            aiString name;
            name.data[ 0 ] = '*';
            name.length = 1 + ASSIMP_itoa10( name.data + 1, static_cast<unsigned int>(MAXLEN-1), static_cast<int32_t>(mTextures.size()) );

            archive->Close( pTextureStream );

            pMatHelper->AddProperty( &name, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
            mTextures.push_back( pTexture );
        } else {
            // If it doesn't exist in the archive, it is probably just a reference to an external file.
            // We'll leave it up to the user to figure out which extension the file has.
            aiString name;
            strncpy( name.data, pTexture->strName, sizeof name.data );
            name.length = strlen( name.data );
            pMatHelper->AddProperty( &name, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
        }
    }

    return res;
}